

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_types.cpp
# Opt level: O3

void __thiscall jaegertracing::thrift::DependencyLink::write(DependencyLink *this)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  
  write((DependencyLink *)(&this->field_0x0 + *(long *)(*(long *)this + -0x28)),in_ESI,in_RDX,in_RCX
       );
  return;
}

Assistant:

uint32_t DependencyLink::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("DependencyLink");

  xfer += oprot->writeFieldBegin("parent", ::apache::thrift::protocol::T_STRING, 1);
  xfer += oprot->writeString(this->parent);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("child", ::apache::thrift::protocol::T_STRING, 2);
  xfer += oprot->writeString(this->child);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("callCount", ::apache::thrift::protocol::T_I64, 4);
  xfer += oprot->writeI64(this->callCount);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}